

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<CPP::WriteInitialization::Buddy>::
emplace<CPP::WriteInitialization::Buddy>
          (QMovableArrayOps<CPP::WriteInitialization::Buddy> *this,qsizetype i,Buddy *args)

{
  Buddy **ppBVar1;
  Buddy *pBVar2;
  Data *pDVar3;
  long lVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  Data *pDVar8;
  char16_t *pcVar9;
  qsizetype qVar10;
  Buddy *pBVar11;
  qsizetype *pqVar12;
  bool bVar13;
  
  pDVar3 = (this->super_QGenericArrayOps<CPP::WriteInitialization::Buddy>).
           super_QArrayDataPointer<CPP::WriteInitialization::Buddy>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    lVar4 = (this->super_QGenericArrayOps<CPP::WriteInitialization::Buddy>).
            super_QArrayDataPointer<CPP::WriteInitialization::Buddy>.size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar4 !=
        ((long)((long)(this->super_QGenericArrayOps<CPP::WriteInitialization::Buddy>).
                      super_QArrayDataPointer<CPP::WriteInitialization::Buddy>.ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
        -0x5555555555555555)) {
      pBVar11 = (this->super_QGenericArrayOps<CPP::WriteInitialization::Buddy>).
                super_QArrayDataPointer<CPP::WriteInitialization::Buddy>.ptr;
      pDVar5 = (args->labelVarName).d.d;
      (args->labelVarName).d.d = (Data *)0x0;
      pBVar11[lVar4].labelVarName.d.d = pDVar5;
      pcVar6 = (args->labelVarName).d.ptr;
      (args->labelVarName).d.ptr = (char16_t *)0x0;
      pBVar11[lVar4].labelVarName.d.ptr = pcVar6;
      qVar7 = (args->labelVarName).d.size;
      (args->labelVarName).d.size = 0;
      pBVar11[lVar4].labelVarName.d.size = qVar7;
      pDVar5 = (args->buddyAttributeName).d.d;
      (args->buddyAttributeName).d.d = (Data *)0x0;
      pBVar11[lVar4].buddyAttributeName.d.d = pDVar5;
      pcVar6 = (args->buddyAttributeName).d.ptr;
      (args->buddyAttributeName).d.ptr = (char16_t *)0x0;
      pBVar11[lVar4].buddyAttributeName.d.ptr = pcVar6;
      qVar7 = (args->buddyAttributeName).d.size;
      (args->buddyAttributeName).d.size = 0;
      pBVar11[lVar4].buddyAttributeName.d.size = qVar7;
      goto LAB_001398fb;
    }
    if (((i == 0) && (pDVar3 != (Data *)0x0)) &&
       ((Buddy *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) !=
        (this->super_QGenericArrayOps<CPP::WriteInitialization::Buddy>).
        super_QArrayDataPointer<CPP::WriteInitialization::Buddy>.ptr)) {
      pBVar11 = (this->super_QGenericArrayOps<CPP::WriteInitialization::Buddy>).
                super_QArrayDataPointer<CPP::WriteInitialization::Buddy>.ptr;
      pDVar5 = (args->labelVarName).d.d;
      (args->labelVarName).d.d = (Data *)0x0;
      pBVar11[-1].labelVarName.d.d = pDVar5;
      pcVar6 = (args->labelVarName).d.ptr;
      (args->labelVarName).d.ptr = (char16_t *)0x0;
      pBVar11[-1].labelVarName.d.ptr = pcVar6;
      qVar7 = (args->labelVarName).d.size;
      (args->labelVarName).d.size = 0;
      pBVar11[-1].labelVarName.d.size = qVar7;
      pDVar5 = (args->buddyAttributeName).d.d;
      (args->buddyAttributeName).d.d = (Data *)0x0;
      pBVar11[-1].buddyAttributeName.d.d = pDVar5;
      pcVar6 = (args->buddyAttributeName).d.ptr;
      (args->buddyAttributeName).d.ptr = (char16_t *)0x0;
      pBVar11[-1].buddyAttributeName.d.ptr = pcVar6;
      qVar7 = (args->buddyAttributeName).d.size;
      (args->buddyAttributeName).d.size = 0;
      pBVar11[-1].buddyAttributeName.d.size = qVar7;
      ppBVar1 = &(this->super_QGenericArrayOps<CPP::WriteInitialization::Buddy>).
                 super_QArrayDataPointer<CPP::WriteInitialization::Buddy>.ptr;
      *ppBVar1 = *ppBVar1 + -1;
      goto LAB_001398fb;
    }
  }
  pDVar5 = (args->labelVarName).d.d;
  pcVar6 = (args->labelVarName).d.ptr;
  (args->labelVarName).d.d = (Data *)0x0;
  (args->labelVarName).d.ptr = (char16_t *)0x0;
  qVar7 = (args->labelVarName).d.size;
  pDVar8 = (args->buddyAttributeName).d.d;
  (args->labelVarName).d.size = 0;
  (args->buddyAttributeName).d.d = (Data *)0x0;
  pcVar9 = (args->buddyAttributeName).d.ptr;
  qVar10 = (args->buddyAttributeName).d.size;
  (args->buddyAttributeName).d.ptr = (char16_t *)0x0;
  (args->buddyAttributeName).d.size = 0;
  bVar13 = (this->super_QGenericArrayOps<CPP::WriteInitialization::Buddy>).
           super_QArrayDataPointer<CPP::WriteInitialization::Buddy>.size != 0;
  QArrayDataPointer<CPP::WriteInitialization::Buddy>::detachAndGrow
            ((QArrayDataPointer<CPP::WriteInitialization::Buddy> *)this,(uint)(i == 0 && bVar13),1,
             (Buddy **)0x0,(QArrayDataPointer<CPP::WriteInitialization::Buddy> *)0x0);
  pBVar11 = (this->super_QGenericArrayOps<CPP::WriteInitialization::Buddy>).
            super_QArrayDataPointer<CPP::WriteInitialization::Buddy>.ptr;
  if (i == 0 && bVar13) {
    pBVar11[-1].labelVarName.d.d = pDVar5;
    pBVar11[-1].labelVarName.d.ptr = pcVar6;
    pBVar11[-1].labelVarName.d.size = qVar7;
    pBVar11[-1].buddyAttributeName.d.d = pDVar8;
    pBVar11[-1].buddyAttributeName.d.ptr = pcVar9;
    pBVar11[-1].buddyAttributeName.d.size = qVar10;
    (this->super_QGenericArrayOps<CPP::WriteInitialization::Buddy>).
    super_QArrayDataPointer<CPP::WriteInitialization::Buddy>.ptr = pBVar11 + -1;
  }
  else {
    pBVar2 = pBVar11 + i;
    memmove(pBVar2 + 1,pBVar11 + i,
            ((this->super_QGenericArrayOps<CPP::WriteInitialization::Buddy>).
             super_QArrayDataPointer<CPP::WriteInitialization::Buddy>.size - i) * 0x30);
    (pBVar2->labelVarName).d.d = pDVar5;
    (pBVar2->labelVarName).d.ptr = pcVar6;
    (pBVar2->labelVarName).d.size = qVar7;
    (pBVar2->buddyAttributeName).d.d = pDVar8;
    (pBVar2->buddyAttributeName).d.ptr = pcVar9;
    (pBVar2->buddyAttributeName).d.size = qVar10;
  }
LAB_001398fb:
  pqVar12 = &(this->super_QGenericArrayOps<CPP::WriteInitialization::Buddy>).
             super_QArrayDataPointer<CPP::WriteInitialization::Buddy>.size;
  *pqVar12 = *pqVar12 + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }